

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode N_VScaleVectorArray_Serial(int nvec,sunrealtype *c,N_Vector *X,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (nvec == 1) {
    N_VScale_Serial(*c,*X,*Z);
  }
  else {
    uVar5 = 0;
    uVar3 = *(*Z)->content;
    if ((long)*(*Z)->content < 1) {
      uVar3 = uVar5;
    }
    if (0 < nvec) {
      uVar5 = (ulong)(uint)nvec;
    }
    if (X == Z) {
      for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        lVar1 = *(long *)((long)X[uVar4]->content + 0x10);
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          *(double *)(lVar1 + uVar6 * 8) = c[uVar4] * *(double *)(lVar1 + uVar6 * 8);
        }
      }
    }
    else {
      for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        lVar1 = *(long *)((long)X[uVar4]->content + 0x10);
        lVar2 = *(long *)((long)Z[uVar4]->content + 0x10);
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          *(double *)(lVar2 + uVar6 * 8) = c[uVar4] * *(double *)(lVar1 + uVar6 * 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleVectorArray_Serial(int nvec, sunrealtype* c, N_Vector* X,
                                      N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* zd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VScale */
  if (nvec == 1)
  {
    N_VScale_Serial(c[0], X[0], Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[i] *= c[i]
   */
  if (X == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { xd[j] *= c[i]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i] = c[i] * X[i]
   */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = c[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}